

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,big_decimal_fp *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar6;
  checked_ptr<typename_basic_string<char>::value_type> it;
  long lVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  char cVar11;
  undefined7 in_register_00000081;
  ulong uVar12;
  char local_c5;
  int num_zeros;
  sign_t sign;
  int significand_size;
  basic_format_specs<char> *local_b8;
  uint local_ac;
  ulong local_a8;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  char *significand;
  int local_90;
  int exp;
  float_specs fspecs_local;
  anon_class_40_7_ef14d3db write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  local_ac = (uint)CONCAT71(in_register_00000081,decimal_point);
  pcVar2 = fp->significand;
  iVar1 = fp->significand_size;
  uVar3 = fspecs._4_4_;
  sign = uVar3 >> 8 & 0xff;
  local_a8 = (ulong)((uint)(sign != none) + iVar1);
  iVar9 = fp->exponent;
  local_90 = iVar9 + iVar1 + -1;
  local_c5 = decimal_point;
  significand_size = iVar1;
  local_b8 = specs;
  local_a0.container = out.container;
  significand = pcVar2;
  fspecs_local = fspecs;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_90;
  bVar4 = write_float<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v7::detail::big_decimal_fp,_char>
          ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  bVar6 = local_a0;
  iVar10 = fspecs.precision;
  if (bVar4) {
    iVar9 = iVar9 + iVar1;
    if ((uVar3 >> 0x14 & 1) == 0) {
      uVar5 = 0;
      uVar12 = (ulong)(local_ac & 0xff);
      if (iVar1 == 1) {
        uVar12 = uVar5;
      }
      cVar11 = (char)uVar12;
      uVar12 = local_a8;
    }
    else {
      uVar5 = 0;
      if (0 < iVar10 - iVar1) {
        uVar5 = (ulong)(uint)(iVar10 - iVar1);
      }
      uVar12 = local_a8 + uVar5;
      cVar11 = (char)local_ac;
    }
    iVar10 = 1 - iVar9;
    if (0 < iVar9) {
      iVar10 = local_90;
    }
    lVar7 = 2;
    if (99 < iVar10) {
      lVar7 = (ulong)(999 < iVar10) + 3;
    }
    sVar8 = (3 - (ulong)(cVar11 == '\0')) + uVar12 + lVar7;
    write._0_8_ = CONCAT44(write._4_4_,uVar3 >> 8) & 0xffffffff000000ff;
    write.decimal_point = cVar11;
    write.significand_size = iVar1;
    write._24_8_ = CONCAT35(write._29_3_,CONCAT14(((uVar3 >> 0x10 & 1) == 0) << 5,(int)uVar5)) |
                   0x4500000000;
    write.output_exp = local_90;
    write.significand = pcVar2;
    if (0 < local_b8->width) {
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                        (local_a0,local_b8,sVar8,&write);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
    it = reserve<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                   (local_a0,sVar8);
    write_float<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v7::detail::big_decimal_fp,_char>
    ::anon_class_40_7_ef14d3db::operator()(&write,it);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )bVar6.container;
  }
  iVar9 = fp->exponent;
  exp = iVar9 + iVar1;
  if ((long)iVar9 < 0) {
    if (0 < exp) {
      num_zeros = iVar10 - iVar1 & (int)(uVar3 << 0xb) >> 0x1f;
      uVar3 = num_zeros;
      if (num_zeros < 1) {
        uVar3 = 0;
      }
      write._0_8_ = &sign;
      write.significand = (char *)&significand;
      write._16_8_ = &significand_size;
      write._24_8_ = &exp;
      write._32_8_ = &local_c5;
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_>
                        (local_a0,local_b8,(ulong)uVar3 + 1 + local_a8,
                         (anon_class_48_6_48d028d1 *)&write);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
    iVar9 = -exp;
    num_zeros = iVar9;
    if (SBORROW4(iVar10,iVar9) != iVar10 + exp < 0) {
      num_zeros = iVar10;
    }
    if (iVar10 < 0) {
      num_zeros = iVar9;
    }
    if (iVar1 != 0) {
      num_zeros = iVar9;
    }
    write.significand = (char *)&num_zeros;
    write._0_8_ = &sign;
    write._16_8_ = &significand_size;
    write._24_8_ = &fspecs_local;
    write._32_8_ = &local_c5;
    bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_>
                      (local_a0,local_b8,(num_zeros + 2) + local_a8,
                       (anon_class_48_6_9afe1116 *)&write);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )bVar6.container;
  }
  sVar8 = (long)iVar9 + local_a8;
  num_zeros = iVar10 - exp;
  uVar5 = (ulong)(uint)num_zeros;
  if ((uVar3 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < num_zeros) {
      if (num_zeros < 1) goto LAB_001808b8;
    }
    else {
      num_zeros = 1;
      uVar5 = 1;
    }
    sVar8 = sVar8 + uVar5;
  }
LAB_001808b8:
  write._0_8_ = &sign;
  write.significand = (char *)&significand;
  write._16_8_ = &significand_size;
  write._32_8_ = &fspecs_local;
  write._24_8_ = fp;
  bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp_const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_>
                    (local_a0,local_b8,sVar8,(anon_class_56_7_a2a26a24 *)&write);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )bVar6.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}